

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O0

void __thiscall
Detail::VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double>::VTKPointDescriptorEntryImpl
          (VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double> *this,string *name,
          offset_in_MercuryParticle<2UL>_to_double member,size_t nComponents)

{
  undefined8 in_RCX;
  _func_int **in_RDX;
  string *in_RSI;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *in_RDI;
  string *in_stack_ffffffffffffff98;
  string local_40 [32];
  undefined8 local_20;
  _func_int **local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_40,in_RSI);
  VTKPointDescriptorEntry<MercuryParticle<2UL>_>::VTKPointDescriptorEntry
            (in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_40);
  in_RDI->_vptr_VTKPointDescriptorEntry = (_func_int **)&PTR__VTKPointDescriptorEntryImpl_00122ce8;
  in_RDI[1]._vptr_VTKPointDescriptorEntry = local_18;
  *(undefined8 *)&in_RDI[1].name_ = local_20;
  return;
}

Assistant:

VTKPointDescriptorEntryImpl(std::string name, V T::*member, std::size_t nComponents)
        : VTKPointDescriptorEntry<T>(name), member_(member), nComponents_(nComponents)
      { }